

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
* __thiscall
wallet::LegacyScriptPubKeyMan::GetReservedDestination
          (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
           *__return_storage_ptr__,LegacyScriptPubKeyMan *this,OutputType type,bool internal,
          int64_t *index,CKeyPool *keypool)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  bilingual_str *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  OutputType local_154;
  unique_lock<std::recursive_mutex> local_150;
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_140;
  bilingual_str local_f0;
  bilingual_str local_b0;
  bilingual_str local_70;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_154 = type;
  sVar3 = std::
          _Hashtable<OutputType,_OutputType,_std::allocator<OutputType>,_std::__detail::_Identity,_std::equal_to<OutputType>,_std::hash<OutputType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count((_Hashtable<OutputType,_OutputType,_std::allocator<OutputType>,_std::__detail::_Identity,_std::equal_to<OutputType>,_std::hash<OutputType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)wallet::LEGACY_OUTPUT_TYPES,&local_154);
  if (sVar3 == 0) {
    _(&local_70,(ConstevalStringLiteral)0x3fdd20);
    std::__detail::__variant::
    _Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
    ::_Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
                *)__return_storage_ptr__,&local_70);
    bilingual_str::~bilingual_str(&local_70);
    goto LAB_001f08d6;
  }
  if (local_154 == BECH32M) {
    __assert_fail("type != OutputType::BECH32M",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x136,
                  "virtual util::Result<CTxDestination> wallet::LegacyScriptPubKeyMan::GetReservedDestination(const OutputType, bool, int64_t &, CKeyPool &)"
                 );
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_150,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x138,false);
  iVar2 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xd])
                    (this,(ulong)internal);
  if ((char)iVar2 == '\0') {
    _(&local_b0,(ConstevalStringLiteral)0x3fde63);
    std::__detail::__variant::
    _Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
    ::_Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
                *)__return_storage_ptr__,&local_b0);
    this_00 = &local_b0;
LAB_001f08c7:
    bilingual_str::~bilingual_str(this_00);
  }
  else {
    (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[9])(this,0);
    bVar1 = ReserveKeyFromKeyPool(this,index,keypool,internal);
    if (!bVar1) {
      _(&local_f0,(ConstevalStringLiteral)0x3fde63);
      std::__detail::__variant::
      _Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
      ::_Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
                  *)__return_storage_ptr__,&local_f0);
      this_00 = &local_f0;
      goto LAB_001f08c7;
    }
    GetDestinationForKey((CTxDestination *)&local_140,&keypool->vchPubKey,local_154);
    std::__detail::__variant::
    _Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
    ::
    _Variant_storage<1ul,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
              ((_Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
                *)__return_storage_ptr__,&local_140);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage(&local_140);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_150);
LAB_001f08d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CTxDestination> LegacyScriptPubKeyMan::GetReservedDestination(const OutputType type, bool internal, int64_t& index, CKeyPool& keypool)
{
    if (LEGACY_OUTPUT_TYPES.count(type) == 0) {
        return util::Error{_("Error: Legacy wallets only support the \"legacy\", \"p2sh-segwit\", and \"bech32\" address types")};
    }
    assert(type != OutputType::BECH32M);

    LOCK(cs_KeyStore);
    if (!CanGetAddresses(internal)) {
        return util::Error{_("Error: Keypool ran out, please call keypoolrefill first")};
    }

    // Fill-up keypool if needed
    TopUp();

    if (!ReserveKeyFromKeyPool(index, keypool, internal)) {
        return util::Error{_("Error: Keypool ran out, please call keypoolrefill first")};
    }
    return GetDestinationForKey(keypool.vchPubKey, type);
}